

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

LY_ERR ly_path_append(ly_ctx *ctx,ly_path *src,ly_path **dst)

{
  LY_ERR LVar1;
  ly_path *__s;
  ly_path_predicate *local_90;
  ly_path_predicate *local_80;
  ly_path_predicate *local_70;
  ly_path_predicate *local_68;
  undefined8 *local_50;
  char *p___1;
  char *p__;
  ly_path *p;
  uint64_t u;
  LY_ERR ret;
  ly_path **dst_local;
  ly_path *src_local;
  ly_ctx *ctx_local;
  
  if (src == (ly_path *)0x0) {
    return LY_SUCCESS;
  }
  if (*dst == (ly_path *)0x0) {
    if (src == (ly_path *)0x0) {
      local_70 = (ly_path_predicate *)0x0;
    }
    else {
      local_70 = src[-1].predicates;
    }
    p___1 = (char *)calloc(1,(long)local_70 * 0x18 + 8);
    if (p___1 == (char *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_append");
      return LY_EMEM;
    }
  }
  else {
    if (src == (ly_path *)0x0) {
      local_68 = (ly_path_predicate *)0x0;
    }
    else {
      local_68 = src[-1].predicates;
    }
    p___1 = (char *)realloc(&(*dst)[-1].predicates,
                            ((long)&local_68->type + (long)&((*dst)[-1].predicates)->type) * 0x18 +
                            8);
    if (p___1 == (char *)0x0) {
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_append");
      return LY_EMEM;
    }
  }
  *dst = (ly_path *)(p___1 + 8);
  if (*dst != (ly_path *)0x0) {
    if (src == (ly_path *)0x0) {
      local_80 = (ly_path_predicate *)0x0;
    }
    else {
      local_80 = src[-1].predicates;
    }
    memset(*dst + *(long *)p___1,0,(long)local_80 * 0x18);
  }
  p = (ly_path *)0x0;
  while( true ) {
    if (src == (ly_path *)0x0) {
      local_90 = (ly_path_predicate *)0x0;
    }
    else {
      local_90 = src[-1].predicates;
    }
    if (local_90 <= p) {
      return LY_SUCCESS;
    }
    if (*dst == (ly_path *)0x0) {
      local_50 = (undefined8 *)malloc(0x20);
      if (local_50 == (undefined8 *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_append");
        return LY_EMEM;
      }
      *local_50 = 1;
    }
    else {
      (*dst)[-1].predicates = (ly_path_predicate *)((long)&((*dst)[-1].predicates)->type + 1);
      local_50 = (undefined8 *)
                 realloc(&(*dst)[-1].predicates,(long)(*dst)[-1].predicates * 0x18 + 8);
      if (local_50 == (undefined8 *)0x0) {
        (*dst)[-1].predicates =
             (ly_path_predicate *)((long)&(*dst)[-1].predicates[-1].field_1 + 0x2f);
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_path_append");
        return LY_EMEM;
      }
    }
    *dst = (ly_path *)(local_50 + 1);
    __s = *dst + (long)&(*dst)[-1].predicates[-1].field_1.position + 0x2f;
    memset(__s,0,0x18);
    __s->node = src[(long)p].node;
    __s->ext = src[(long)p].ext;
    LVar1 = ly_path_dup_predicates(ctx,src[(long)p].predicates,&__s->predicates);
    if (LVar1 != LY_SUCCESS) break;
    p = (ly_path *)((long)&p->node + 1);
  }
  return LVar1;
}

Assistant:

static LY_ERR
ly_path_append(const struct ly_ctx *ctx, const struct ly_path *src, struct ly_path **dst)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u;
    struct ly_path *p;

    if (!src) {
        return LY_SUCCESS;
    }

    LY_ARRAY_CREATE_RET(ctx, *dst, LY_ARRAY_COUNT(src), LY_EMEM);
    LY_ARRAY_FOR(src, u) {
        LY_ARRAY_NEW_GOTO(ctx, *dst, p, ret, cleanup);
        p->node = src[u].node;
        p->ext = src[u].ext;
        LY_CHECK_GOTO(ret = ly_path_dup_predicates(ctx, src[u].predicates, &p->predicates), cleanup);
    }

cleanup:
    return ret;
}